

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O3

basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> * __thiscall
type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>::
map<C_A_T_C_H_T_E_S_T_0()::functor_t&,int,void,void>
          (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>
           *__return_storage_ptr__,
          basic_variant<type_safe::optional_variant_policy,int,double,debugger_type> *this,
          functor_t *f,int *args)

{
  variant_storage<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pvVar1;
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pbVar2;
  
  (__return_storage_ptr__->storage_).storage_.cur_type_.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = 0;
  pbVar2 = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)
            (this + 0x10);
  if (pbVar2 == (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)0x3
     ) {
    tagged_union<int,_double,_debugger_type>::check<debugger_type>
              ((tagged_union<int,_double,_debugger_type> *)this);
    ::C_A_T_C_H_T_E_S_T_0::functor_t::operator()(f,(debugger_type *)this,*args);
    pvVar1 = &__return_storage_ptr__->storage_;
    (pvVar1->storage_).storage_.storage_[0] = '*';
    (pvVar1->storage_).storage_.storage_[1] = '\0';
    (pvVar1->storage_).storage_.storage_[2] = '\0';
    (pvVar1->storage_).storage_.storage_[3] = '\0';
  }
  else {
    if (pbVar2 == (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
                  0x2) {
      tagged_union<int,_double,_debugger_type>::check<double>
                ((tagged_union<int,_double,_debugger_type> *)this);
      *(undefined8 *)(__return_storage_ptr__->storage_).storage_.storage_.storage_ =
           *(undefined8 *)this;
      pbVar2 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)0x2;
      goto LAB_001d2cf1;
    }
    if (pbVar2 != (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)
                  0x1) {
      return pbVar2;
    }
    tagged_union<int,_double,_debugger_type>::check<int>
              ((tagged_union<int,_double,_debugger_type> *)this);
    ::C_A_T_C_H_T_E_S_T_0::functor_t::operator()(f,*(int *)this,*args);
    pvVar1 = &__return_storage_ptr__->storage_;
    (pvVar1->storage_).storage_.storage_[0] = '\f';
    (pvVar1->storage_).storage_.storage_[1] = '\0';
    (pvVar1->storage_).storage_.storage_[2] = '\0';
    (pvVar1->storage_).storage_.storage_[3] = '\0';
  }
  pbVar2 = (basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *)0x1;
LAB_001d2cf1:
  (__return_storage_ptr__->storage_).storage_.cur_type_.
  super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>.
  value_ = (unsigned_long)pbVar2;
  return pbVar2;
}

Assistant:

basic_variant map(Functor&& f, Args&&... args) const TYPE_SAFE_LVALUE_REF
    {
        basic_variant result(force_empty{});
        if (!has_value())
            return result;
        detail::map_union<Functor&&, union_t>::map(result.storage_.get_union(),
                                                   storage_.get_union(), std::forward<Functor>(f),
                                                   std::forward<Args>(args)...);
        DEBUG_ASSERT(result.has_value(), detail::assert_handler{});
        return result;
    }